

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O3

CallInfo * growCI(lua_State *L)

{
  int *piVar1;
  int iVar2;
  CallInfo *pCVar3;
  uint uVar4;
  StkId pTVar5;
  StkId pTVar6;
  StkId pTVar7;
  int iVar8;
  
  if (L->size_ci < 0x4e21) {
    luaD_reallocCI(L,L->size_ci * 2);
    if (20000 < L->size_ci) {
      luaG_runerror(L,"stack overflow");
    }
    pCVar3 = L->ci;
    L->ci = pCVar3 + 1;
    return pCVar3 + 1;
  }
  pTVar6 = (StkId)0x5;
  luaD_throw(L,5);
  if ((L->hookmask & 2) != 0) {
    pTVar7 = L->stack;
    luaD_callhook(L,1,-1);
    if ((((L->ci->func->value).gc)->h).flags == '\0') {
      while ((L->hookmask & 2) != 0) {
        piVar1 = &L->ci->tailcalls;
        iVar2 = *piVar1;
        *piVar1 = *piVar1 + -1;
        if (iVar2 == 0) break;
        luaD_callhook(L,4,-1);
      }
    }
    pTVar6 = (StkId)(((long)pTVar6 - (long)pTVar7) + (long)L->stack);
  }
  pCVar3 = L->ci;
  L->ci = pCVar3 + -1;
  pTVar7 = pCVar3->func;
  iVar2 = pCVar3->nresults;
  L->base = pCVar3[-1].base;
  L->savedpc = pCVar3[-1].savedpc;
  if (iVar2 != 0) {
    iVar8 = 0;
    pTVar5 = pTVar7;
    do {
      if (L->top <= pTVar6) {
        pTVar7 = pTVar5;
        if (0 < iVar2 - iVar8) {
          uVar4 = (iVar2 + 1) - iVar8;
          do {
            pTVar5->tt = 0;
            pTVar5 = pTVar5 + 1;
            uVar4 = uVar4 - 1;
            pTVar7 = pTVar5;
          } while (1 < uVar4);
        }
        break;
      }
      pTVar7 = pTVar5 + 1;
      pTVar5->value = pTVar6->value;
      pTVar5->tt = pTVar6->tt;
      iVar8 = iVar8 + 1;
      pTVar6 = pTVar6 + 1;
      pTVar5 = pTVar7;
    } while (iVar2 != iVar8);
  }
  L->top = pTVar7;
  return (CallInfo *)(ulong)(iVar2 + 1);
}

Assistant:

static CallInfo *growCI (lua_State *L) {
  if (L->size_ci > LUAI_MAXCALLS)  /* overflow while handling overflow? */
    luaD_throw(L, LUA_ERRERR);
  else {
    luaD_reallocCI(L, 2*L->size_ci);
    if (L->size_ci > LUAI_MAXCALLS)
      luaG_runerror(L, "stack overflow");
  }
  return ++L->ci;
}